

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_easy_api.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string stub;
  string sopts;
  string solver;
  allocator<char> local_f1;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,argv[1],(allocator<char> *)&local_d0);
    if (argc == 2) {
      pcVar3 = "";
    }
    else {
      pcVar3 = argv[2];
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,pcVar3,(allocator<char> *)&local_f0);
    if ((uint)argc < 4) {
      pcVar3 = "";
      bVar1 = true;
    }
    else {
      iVar2 = strcmp("text",argv[3]);
      bVar1 = iVar2 != 0;
      if (argc == 4) {
        pcVar3 = "";
      }
      else {
        pcVar3 = argv[4];
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar3,&local_f1);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_50,local_48 + (long)local_50);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_d0,local_c8 + (long)local_d0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_f0,local_e8 + (long)local_f0);
    bVar1 = SolveAndCheck(&local_70,&local_90,bVar1,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    return (int)!bVar1;
  }
  puts(
      "AMPL NL writer example.\nUsage:\n  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\nwhere <solver> is ipopt, gurobi, minos, ...;\nbinary/text is the NL format (default: binary.)\nExamples:\n  <this_exe> ipopt \"\" text /tmp/stub\n  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\""
      );
  exit(0);
}

Assistant:

int main(int argc, const char* const* argv) {
  if (argc<2) {
    printf("%s\n",
           "AMPL NL writer example.\n"
           "Usage:\n"
           "  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\n"
           "where <solver> is ipopt, gurobi, minos, ...;\n"
           "binary/text is the NL format (default: binary.)\n"
           "Examples:\n"
           "  <this_exe> ipopt \"\" text /tmp/stub\n"
           "  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\"");
    exit(0);
  }
  std::string solver = (argc>1) ? argv[1] : "minos";
  std::string sopts = (argc>2) ? argv[2] : "";
  bool binary = (argc<=3) || std::strcmp("text", argv[3]);
  std::string stub = (argc>4) ? argv[4] : "";

  if (!SolveAndCheck(solver, sopts, binary, stub))
    return EXIT_FAILURE;
  return EXIT_SUCCESS;
}